

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall
QListView::currentChanged(QListView *this,QModelIndex *current,QModelIndex *previous)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  code *local_38;
  undefined8 local_30;
  QListView *pQStack_28;
  int local_20;
  undefined4 uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::currentChanged((QAbstractItemView *)this,current,previous);
  cVar1 = QAccessible::isActive();
  if (cVar1 != '\0') {
    bVar2 = QModelIndex::isValid(current);
    if (bVar2) {
      bVar2 = QWidget::hasFocus((QWidget *)this);
      if (bVar2) {
        iVar3 = visualIndex(this,current);
        local_38 = QFont::strikeOut;
        local_30 = 0xaaaaaaaa00008005;
        _local_20 = CONCAT44(0xaaaaaaaa,iVar3);
        pQStack_28 = this;
        QAccessible::updateAccessibility((QAccessibleEvent *)&local_38);
        QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_38);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::currentChanged(const QModelIndex &current, const QModelIndex &previous)
{
    QAbstractItemView::currentChanged(current, previous);
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        if (current.isValid() && hasFocus()) {
            int entry = visualIndex(current);
            QAccessibleEvent event(this, QAccessible::Focus);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
}